

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

LY_ERR ly_out_new_memory(char **strp,size_t size,ly_out **out)

{
  ly_out *plVar1;
  char *pcVar2;
  
  if (out == (ly_out **)0x0) {
    pcVar2 = "out";
  }
  else {
    if (strp != (char **)0x0) {
      plVar1 = (ly_out *)calloc(1,0x50);
      *out = plVar1;
      if (plVar1 == (ly_out *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_out_new_memory"
              );
        return LY_EMEM;
      }
      plVar1->type = LY_OUT_MEMORY;
      (plVar1->method).mem.buf = strp;
      if (size != 0) {
        if (*strp == (char *)0x0) {
          return LY_SUCCESS;
        }
        (plVar1->method).mem.size = size;
        return LY_SUCCESS;
      }
      *strp = (char *)0x0;
      return LY_SUCCESS;
    }
    pcVar2 = "strp";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_out_new_memory");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_new_memory(char **strp, size_t size, struct ly_out **out)
{
    LY_CHECK_ARG_RET(NULL, out, strp, LY_EINVAL);

    *out = calloc(1, sizeof **out);
    LY_CHECK_ERR_RET(!*out, LOGMEM(NULL), LY_EMEM);

    (*out)->type = LY_OUT_MEMORY;
    (*out)->method.mem.buf = strp;
    if (!size) {
        /* buffer is supposed to be allocated */
        *strp = NULL;
    } else if (*strp) {
        /* there is already buffer to use */
        (*out)->method.mem.size = size;
    }

    return LY_SUCCESS;
}